

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c1a4f9::MemPoolAccept::ConsensusScriptChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  base_blob<256u> *this_00;
  CTransaction *this_01;
  CTxMemPool *hash;
  ChainstateManager *pCVar1;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  uint flags;
  CCoinsViewCache *this_02;
  CTxOut *b;
  CTxOut *a;
  ulong uVar5;
  pointer outpoint;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string local_78;
  _Alloc_hider local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (base_blob<256u> *)args[3].m_accept_time;
  this_01 = *(CTransaction **)
             ((args[3].m_chainparams)->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems;
  flags = GetBlockScriptFlags((this->m_active_chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1],
                              this->m_active_chainstate->m_chainman);
  hash = this->m_pool;
  this_02 = Chainstate::CoinsTip(this->m_active_chainstate);
  pCVar1 = this->m_active_chainstate->m_chainman;
  bVar3 = CTransaction::IsCoinBase(this_01);
  if (bVar3) {
    __assert_fail("!tx.IsCoinBase()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x196,
                  "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                 );
  }
  pCVar2 = (this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (outpoint = (this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start; outpoint != pCVar2; outpoint = outpoint + 1) {
    b = &CCoinsViewCache::AccessCoin(&this->m_view,&outpoint->prevout)->out;
    if (b->nValue == -1) goto LAB_00379cd2;
    CTxMemPool::get((CTxMemPool *)&stack0xffffffffffffffa8,(uint256 *)hash);
    if (local_58._M_p == (pointer)0x0) {
      a = &CCoinsViewCache::AccessCoin(this_02,&outpoint->prevout)->out;
      if (a->nValue == -1) {
        __assert_fail("!coinFromUTXOSet.IsSpent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1aa,
                      "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                     );
      }
      bVar3 = ::operator==(a,b);
      if (!bVar3) {
        __assert_fail("coinFromUTXOSet.out == coin.out",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1ab,
                      "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                     );
      }
    }
    else {
      bVar3 = transaction_identifier<false>::operator==
                        ((transaction_identifier<false> *)(local_58._M_p + 0x39),
                         (transaction_identifier<false> *)outpoint);
      if (!bVar3) {
        __assert_fail("txFrom->GetHash() == txin.prevout.hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1a5,
                      "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                     );
      }
      uVar5 = (ulong)(outpoint->prevout).n;
      if ((ulong)((*(long *)(local_58._M_p + 0x20) - *(long *)(local_58._M_p + 0x18)) / 0x28) <=
          uVar5) {
        __assert_fail("txFrom->vout.size() > txin.prevout.n",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1a6,
                      "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                     );
      }
      bVar3 = ::operator==((CTxOut *)(*(long *)(local_58._M_p + 0x18) + uVar5 * 0x28),b);
      if (!bVar3) {
        __assert_fail("txFrom->vout[txin.prevout.n] == coin.out",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1a7,
                      "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                     );
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
  }
  bVar3 = CheckInputScripts(this_01,(TxValidationState *)&args[3].m_bypass_limits,&this->m_view,
                            flags,true,true,
                            (PrecomputedTransactionData *)&args[4].m_coins_to_uncache,
                            &pCVar1->m_validation_cache,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  bVar4 = true;
  if (!bVar3) {
LAB_00379cd2:
    base_blob<256u>::ToString_abi_cxx11_((string *)&stack0xffffffffffffffa8,this_00);
    ValidationState<TxValidationResult>::ToString_abi_cxx11_
              (&local_78,(ValidationState<TxValidationResult> *)&args[3].m_bypass_limits);
    logging_function._M_str = "ConsensusScriptChecks";
    logging_function._M_len = 0x15;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x505,ALL,Info,
               "BUG! PLEASE REPORT THIS! CheckInputScripts failed against latest-block but not STANDARD flags %s, %s\n"
               ,(string *)&stack0xffffffffffffffa8,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool MemPoolAccept::ConsensusScriptChecks(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    const uint256& hash = ws.m_hash;
    TxValidationState& state = ws.m_state;

    // Check again against the current block tip's script verification
    // flags to cache our script execution flags. This is, of course,
    // useless if the next block has different script flags from the
    // previous one, but because the cache tracks script flags for us it
    // will auto-invalidate and we'll just have a few blocks of extra
    // misses on soft-fork activation.
    //
    // This is also useful in case of bugs in the standard flags that cause
    // transactions to pass as valid when they're actually invalid. For
    // instance the STRICTENC flag was incorrectly allowing certain
    // CHECKSIG NOT scripts to pass, even though they were invalid.
    //
    // There is a similar check in CreateNewBlock() to prevent creating
    // invalid blocks (using TestBlockValidity), however allowing such
    // transactions into the mempool can be exploited as a DoS attack.
    unsigned int currentBlockScriptVerifyFlags{GetBlockScriptFlags(*m_active_chainstate.m_chain.Tip(), m_active_chainstate.m_chainman)};
    if (!CheckInputsFromMempoolAndCache(tx, state, m_view, m_pool, currentBlockScriptVerifyFlags,
                                        ws.m_precomputed_txdata, m_active_chainstate.CoinsTip(), GetValidationCache())) {
        LogPrintf("BUG! PLEASE REPORT THIS! CheckInputScripts failed against latest-block but not STANDARD flags %s, %s\n", hash.ToString(), state.ToString());
        return Assume(false);
    }

    return true;
}